

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyFixNodeLinks(Node *node)

{
  Node *local_18;
  Node *child;
  Node *node_local;
  
  if (node->prev == (Node *)0x0) {
    node->parent->content = node;
  }
  else {
    node->prev->next = node;
  }
  if (node->next == (Node *)0x0) {
    node->parent->last = node;
  }
  else {
    node->next->prev = node;
  }
  for (local_18 = node->content; local_18 != (Node *)0x0; local_18 = local_18->next) {
    local_18->parent = node;
  }
  return;
}

Assistant:

void TY_(FixNodeLinks)(Node *node)
{
    Node *child;

    if (node->prev)
        node->prev->next = node;
    else
        node->parent->content = node;

    if (node->next)
        node->next->prev = node;
    else
        node->parent->last = node;

    for (child = node->content; child; child = child->next)
        child->parent = node;
}